

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::create_regex_term<std::initializer_list<char_const*>>
          (string *__return_storage_ptr__,void *this,initializer_list<const_char_*> regex_piece,
          string *keyword)

{
  char *pcVar1;
  string *psVar2;
  size_t sVar3;
  iterator ppcVar4;
  long lVar5;
  ostringstream os;
  string *local_1b8;
  iterator local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  ppcVar4 = regex_piece._M_array;
  local_1b8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1b0 = ppcVar4;
  if (ppcVar4 != (iterator)0x1) {
    lVar5 = 0;
    do {
      pcVar1 = *(char **)((long)this + lVar5 * 8);
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)&local_1b8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x10);
      }
      else {
        sVar3 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,*(char **)regex_piece._M_len,
                 ((undefined8 *)regex_piece._M_len)[1]);
      lVar5 = lVar5 + 1;
    } while ((long)ppcVar4 + -1 != lVar5);
  }
  pcVar1 = *(char **)((long)this + (long)local_1b0 * 8 + -8);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)&local_1b8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x10);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar3);
  }
  psVar2 = local_1b8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string create_regex_term(T1 regex_piece, const std::string& keyword) {
    std::ostringstream os;
    for(size_t i = 0; i < regex_piece.size()-1; ++i) {
        os << std::begin(regex_piece)[i] << keyword;
    }
    os << std::begin(regex_piece)[regex_piece.size()-1];
    return os.str();
}